

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

string_view __thiscall kratos::SystemVerilogCodeGen::indent(SystemVerilogCodeGen *this)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  string_view sVar6;
  size_type *local_40;
  string result;
  
  if (this->skip_indent_ == true) {
    this->skip_indent_ = false;
    pcVar4 = "";
    uVar2 = 0;
  }
  else {
    if ((this->empty_indent_str_)._M_string_length < this->indent_ * (ulong)this->indent_size) {
      result._M_dataplus._M_p = (pointer)0x0;
      result._M_string_length._0_1_ = 0;
      uVar5 = (int)this->indent_ * this->indent_size;
      local_40 = &result._M_string_length;
      std::__cxx11::string::resize((ulong)&local_40,(char)uVar5);
      if (uVar5 != 0) {
        uVar3 = 0;
        do {
          *(undefined1 *)((long)local_40 + uVar3) = 0x20;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      std::__cxx11::string::_M_assign((string *)&this->empty_indent_str_);
      pcVar1 = (this->empty_indent_str_)._M_dataplus._M_p;
      (this->empty_indent_string_view_)._M_len = (this->empty_indent_str_)._M_string_length;
      (this->empty_indent_string_view_)._M_str = pcVar1;
      if (local_40 != &result._M_string_length) {
        operator_delete(local_40,CONCAT71(result._M_string_length._1_7_,
                                          (undefined1)result._M_string_length) + 1);
      }
    }
    uVar2 = (ulong)this->indent_size * this->indent_;
    uVar3 = (this->empty_indent_string_view_)._M_len;
    if (uVar3 < uVar2) {
      uVar2 = uVar3;
    }
    pcVar4 = (this->empty_indent_string_view_)._M_str;
  }
  sVar6._M_str = pcVar4;
  sVar6._M_len = uVar2;
  return sVar6;
}

Assistant:

std::string_view SystemVerilogCodeGen::indent() {
    if (skip_indent_) {
        skip_indent_ = false;
        return "";
    }
    if (empty_indent_str_.size() < (indent_ * indent_size)) {
        // need to expand the string
        std::string result;
        uint32_t num_indent = indent_ * indent_size;
        result.resize(num_indent);
        for (uint32_t i = 0; i < num_indent; i++) result[i] = ' ';
        empty_indent_str_ = result;
        empty_indent_string_view_ = empty_indent_str_;
    }
    return empty_indent_string_view_.substr(0, indent_ * indent_size);
}